

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderSharedVarTests::init(ShaderSharedVarTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  DataType DVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  char *pcVar5;
  SharedBasicVarCase *pSVar6;
  ShaderAtomicOpTests *this_00;
  Vector<unsigned_int,_3> local_1b4;
  Vector<unsigned_int,_3> local_1a8;
  Vector<unsigned_int,_3> local_19c;
  Vector<unsigned_int,_3> local_190;
  Vector<unsigned_int,_3> local_184;
  Vector<unsigned_int,_3> local_178;
  Vector<unsigned_int,_3> local_16c;
  Vector<unsigned_int,_3> local_160;
  Vector<unsigned_int,_3> local_154;
  Vector<unsigned_int,_3> local_148;
  Vector<unsigned_int,_3> local_13c;
  Vector<unsigned_int,_3> local_130;
  Vector<unsigned_int,_3> local_124;
  Vector<unsigned_int,_3> local_118;
  Vector<unsigned_int,_3> local_10c;
  Vector<unsigned_int,_3> local_100;
  Vector<unsigned_int,_3> local_f4;
  Vector<unsigned_int,_3> local_e8;
  Vector<unsigned_int,_3> local_dc;
  Vector<unsigned_int,_3> local_d0;
  Vector<unsigned_int,_3> local_c4;
  TestNode *local_b8;
  TestCaseGroup *workGroupSizeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  UVec3 workGroupSize_1;
  int precision;
  UVec3 workGroupSize;
  int basicType;
  TestCaseGroup *basicTypeGroup;
  ShaderSharedVarTests *this_local;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic_type",
             "Basic Types");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  for (workGroupSize.m_data[1] = 1; (int)workGroupSize.m_data[1] < 0x27;
      workGroupSize.m_data[1] = workGroupSize.m_data[1] + 1) {
    DVar3 = glu::getDataTypeScalarType(workGroupSize.m_data[1]);
    if (DVar3 != TYPE_DOUBLE) {
      bVar2 = glu::isDataTypeBoolOrBVec(workGroupSize.m_data[1]);
      if (bVar2) {
        tcu::Vector<unsigned_int,_3>::Vector
                  ((Vector<unsigned_int,_3> *)(workGroupSize_1.m_data + 2),2,1,3);
        pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar5 = glu::getDataTypeName(workGroupSize.m_data[1]);
        SharedBasicVarCase::SharedBasicVarCase
                  (pSVar6,pCVar1,pcVar5,workGroupSize.m_data[1],PRECISION_LAST,
                   (UVec3 *)(workGroupSize_1.m_data + 2));
        tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
      }
      else {
        for (workGroupSize_1.m_data[1] = 0; (int)workGroupSize_1.m_data[1] < 3;
            workGroupSize_1.m_data[1] = workGroupSize_1.m_data[1] + 1) {
          tcu::Vector<unsigned_int,_3>::Vector
                    ((Vector<unsigned_int,_3> *)((long)&name.field_2 + 0xc),2,1,3);
          pcVar5 = glu::getDataTypeName(workGroupSize.m_data[1]);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,pcVar5,(allocator<char> *)((long)&workGroupSizeGroup + 7));
          std::operator+(&local_88,&local_a8,"_");
          pcVar5 = glu::getPrecisionName(workGroupSize_1.m_data[1]);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,&local_88,pcVar5);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&workGroupSizeGroup + 7));
          pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          SharedBasicVarCase::SharedBasicVarCase
                    (pSVar6,pCVar1,pcVar5,workGroupSize.m_data[1],workGroupSize_1.m_data[1],
                     (UVec3 *)((long)&name.field_2 + 0xc));
          tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
          std::__cxx11::string::~string((string *)local_68);
        }
      }
    }
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "work_group_size","Shared Variables with Various Work Group Sizes");
  local_b8 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_c4,1,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_1_1_1",TYPE_FLOAT,PRECISION_HIGHP,&local_c4);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_d0,0x40,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_64_1_1",TYPE_FLOAT,PRECISION_HIGHP,&local_d0);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_dc,1,0x40,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_1_64_1",TYPE_FLOAT,PRECISION_HIGHP,&local_dc);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_e8,1,1,0x40);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_1_1_64",TYPE_FLOAT,PRECISION_HIGHP,&local_e8);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_f4,0x80,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_128_1_1",TYPE_FLOAT,PRECISION_HIGHP,&local_f4);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_100,1,0x80,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_1_128_1",TYPE_FLOAT,PRECISION_HIGHP,&local_100);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_10c,0xd,2,4);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"float_13_2_4",TYPE_FLOAT,PRECISION_HIGHP,&local_10c);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_118,1,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_1_1_1",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_118);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_124,0x40,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_64_1_1",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_124);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_130,1,0x40,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_1_64_1",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_130);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_13c,1,1,0x40);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_1_1_64",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_13c);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_148,0x80,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_128_1_1",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_148);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_154,1,0x80,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_1_128_1",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_154);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_160,0xd,2,4);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"vec4_13_2_4",TYPE_FLOAT_VEC4,PRECISION_HIGHP,&local_160);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_16c,1,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_1_1_1",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_16c);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_178,0x40,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_64_1_1",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_178);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_184,1,0x40,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_1_64_1",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_184);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_190,1,1,0x40);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_1_1_64",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_190);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_19c,0x80,1,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_128_1_1",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_19c);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_1a8,1,0x80,1);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_1_128_1",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_1a8);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  pTVar4 = local_b8;
  pSVar6 = (SharedBasicVarCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::Vector<unsigned_int,_3>::Vector(&local_1b4,0xd,2,4);
  SharedBasicVarCase::SharedBasicVarCase
            (pSVar6,pCVar1,"mat4_13_2_4",TYPE_FLOAT_MAT4,PRECISION_HIGHP,&local_1b4);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pSVar6);
  this_00 = (ShaderAtomicOpTests *)operator_new(0x80);
  ShaderAtomicOpTests::ShaderAtomicOpTests
            (this_00,(this->super_TestCaseGroup).m_context,"atomic",ATOMIC_OPERAND_SHARED_VARIABLE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void ShaderSharedVarTests::init (void)
{
	// .basic_type
	{
		tcu::TestCaseGroup *const basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_type", "Basic Types");
		addChild(basicTypeGroup);

		for (int basicType = TYPE_FLOAT; basicType <= TYPE_BOOL_VEC4; basicType++)
		{
			if (glu::getDataTypeScalarType(DataType(basicType)) == glu::TYPE_DOUBLE)
				continue;

			if (glu::isDataTypeBoolOrBVec(DataType(basicType)))
			{
				const tcu::UVec3	workGroupSize	(2,1,3);
				basicTypeGroup->addChild(new SharedBasicVarCase(m_context, getDataTypeName(DataType(basicType)), DataType(basicType), PRECISION_LAST, workGroupSize));
			}
			else
			{
				for (int precision = 0; precision < PRECISION_LAST; precision++)
				{
					const tcu::UVec3	workGroupSize	(2,1,3);
					const string		name			= string(getDataTypeName(DataType(basicType))) + "_" + getPrecisionName(Precision(precision));

					basicTypeGroup->addChild(new SharedBasicVarCase(m_context, name.c_str(), DataType(basicType), Precision(precision), workGroupSize));
				}
			}
		}
	}

	// .work_group_size
	{
		tcu::TestCaseGroup *const workGroupSizeGroup = new tcu::TestCaseGroup(m_testCtx, "work_group_size", "Shared Variables with Various Work Group Sizes");
		addChild(workGroupSizeGroup);

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_64_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_64_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_1_64",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_128_1_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_1_128_1",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "float_13_2_4",		TYPE_FLOAT,			PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_64_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_64_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_1_64",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_128_1_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_1_128_1",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "vec4_13_2_4",		TYPE_FLOAT_VEC4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));

		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_64_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(64,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_64_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,64,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_1_64",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,1,64)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_128_1_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(128,1,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_1_128_1",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(1,128,1)));
		workGroupSizeGroup->addChild(new SharedBasicVarCase(m_context, "mat4_13_2_4",		TYPE_FLOAT_MAT4,	PRECISION_HIGHP,	tcu::UVec3(13,2,4)));
	}

	// .atomic
	addChild(new ShaderAtomicOpTests(m_context, "atomic", ATOMIC_OPERAND_SHARED_VARIABLE));
}